

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O1

void __thiscall QWindowContainer::~QWindowContainer(QWindowContainer *this)

{
  long lVar1;
  long *plVar2;
  
  *(undefined ***)this = &PTR_metaObject_007f6430;
  *(undefined ***)(this + 0x10) = &PTR__QWindowContainer_007f65e0;
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 600) != 0) && (*(int *)(*(long *)(lVar1 + 600) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x260) != 0)) {
    QObject::removeEventFilter(*(QObject **)(lVar1 + 0x260));
    QWindow::destroy();
  }
  if ((*(long *)(lVar1 + 600) == 0) || (*(int *)(*(long *)(lVar1 + 600) + 4) == 0)) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = *(long **)(lVar1 + 0x260);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x20))();
  }
  QWidget::~QWidget((QWidget *)this);
  return;
}

Assistant:

QWindowContainer::~QWindowContainer()
{
    Q_D(QWindowContainer);

    // Call destroy() explicitly first. The dtor would do this too, but
    // QEvent::PlatformSurface delivery relies on virtuals. Getting
    // SurfaceAboutToBeDestroyed can be essential for OpenGL, Vulkan, etc.
    // QWindow subclasses in particular. Keep these working.
    if (d->window) {
        d->window->removeEventFilter(this);
        d->window->destroy();
    }

    delete d->window;
}